

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
 __thiscall anon_unknown.dwarf_2e6623f::AddressDescriptor::Clone(AddressDescriptor *this)

{
  tuple<(anonymous_namespace)::AddressDescriptor_*,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
  this_00;
  pointer __p;
  long in_RSI;
  long in_FS_OFFSET;
  __uniq_ptr_impl<(anonymous_namespace)::AddressDescriptor,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
  local_78;
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_70;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.
  super__Tuple_impl<0UL,_(anonymous_namespace)::AddressDescriptor_*,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
  .super__Head_base<0UL,_(anonymous_namespace)::AddressDescriptor_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_(anonymous_namespace)::AddressDescriptor_*,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
        )operator_new(0xa8);
  ::wallet::_GLOBAL__N_1::std::__detail::__variant::
  _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)&local_70,
                    (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)(in_RSI + 0x58));
  AddressDescriptor((AddressDescriptor *)
                    this_00.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::AddressDescriptor_*,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::AddressDescriptor_*,_false>.
                    _M_head_impl,(CTxDestination *)&local_70);
  local_78._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::AddressDescriptor_*,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
  .super__Head_base<0UL,_(anonymous_namespace)::AddressDescriptor_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::AddressDescriptor_*,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
        )(tuple<(anonymous_namespace)::AddressDescriptor_*,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
          )this_00.
           super__Tuple_impl<0UL,_(anonymous_namespace)::AddressDescriptor_*,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
           .super__Head_base<0UL,_(anonymous_namespace)::AddressDescriptor_*,_false>._M_head_impl;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage(&local_70);
  local_78._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::AddressDescriptor_*,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
  .super__Head_base<0UL,_(anonymous_namespace)::AddressDescriptor_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::AddressDescriptor_*,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
        )(_Tuple_impl<0UL,_(anonymous_namespace)::AddressDescriptor_*,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
          )0x0;
  (this->super_DescriptorImpl).super_Descriptor._vptr_Descriptor =
       (_func_int **)
       this_00.
       super__Tuple_impl<0UL,_(anonymous_namespace)::AddressDescriptor_*,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
       .super__Head_base<0UL,_(anonymous_namespace)::AddressDescriptor_*,_false>._M_head_impl;
  std::
  unique_ptr<(anonymous_namespace)::AddressDescriptor,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::AddressDescriptor,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
                 *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DescriptorImpl> Clone() const override
    {
        return std::make_unique<AddressDescriptor>(m_destination);
    }